

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O1

easm_sinsn * dis_parse_sinsn(disctx *ctx,dis_status *status,int *spos)

{
  etype eVar1;
  litem **pplVar2;
  litem *plVar3;
  int iVar4;
  easm_sinsn *peVar5;
  easm_mods *peVar6;
  easm_operand *peVar7;
  easm_expr **ppeVar8;
  easm_expr *peVar9;
  easm_operand **ppeVar10;
  easm_mod *peVar11;
  easm_mod **ppeVar12;
  int iVar13;
  int iVar14;
  
  peVar5 = (easm_sinsn *)calloc(0x40,1);
  pplVar2 = ctx->atoms;
  plVar3 = pplVar2[*spos];
  peVar5->str = plVar3->str;
  iVar4 = plVar3->isunk;
  peVar5->isunk = iVar4;
  if (iVar4 != 0) {
    *(undefined1 *)status = (char)*status | DIS_STATUS_UNK_INSN;
  }
  iVar4 = *spos;
  *spos = iVar4 + 1;
  if (pplVar2[iVar4]->type != LITEM_NAME) {
    abort();
  }
  peVar6 = (easm_mods *)calloc(0x28,1);
  iVar4 = *spos;
  if (iVar4 < ctx->atomsnum) {
    do {
      pplVar2 = ctx->atoms;
      plVar3 = pplVar2[iVar4];
      eVar1 = plVar3->type;
      if (eVar1 == LITEM_NAME) {
        peVar11 = (easm_mod *)calloc(0x28,1);
        peVar11->str = plVar3->str;
        iVar4 = pplVar2[iVar4]->isunk;
        peVar11->isunk = iVar4;
        if (iVar4 != 0) {
          *(undefined1 *)status = (char)*status | DIS_STATUS_UNK_OPERAND;
        }
        iVar4 = peVar6->modsmax;
        if (iVar4 <= peVar6->modsnum) {
          iVar13 = iVar4 * 2;
          if (iVar4 == 0) {
            iVar13 = 0x10;
          }
          peVar6->modsmax = iVar13;
          ppeVar12 = (easm_mod **)realloc(peVar6->mods,(long)iVar13 << 3);
          peVar6->mods = ppeVar12;
        }
        iVar4 = peVar6->modsnum;
        peVar6->modsnum = iVar4 + 1;
        peVar6->mods[iVar4] = peVar11;
        *spos = *spos + 1;
      }
      else {
        if (eVar1 == LITEM_SEEND) break;
        peVar7 = (easm_operand *)calloc(0x30,1);
        peVar7->mods = peVar6;
        peVar6 = (easm_mods *)calloc(0x28,1);
        iVar4 = peVar7->exprsmax;
        if (iVar4 <= peVar7->exprsnum) {
          iVar13 = iVar4 * 2;
          if (iVar4 == 0) {
            iVar13 = 0x10;
          }
          peVar7->exprsmax = iVar13;
          ppeVar8 = (easm_expr **)realloc(peVar7->exprs,(long)iVar13 << 3);
          peVar7->exprs = ppeVar8;
        }
        peVar9 = dis_parse_expr(ctx,status,spos);
        iVar4 = peVar7->exprsnum;
        peVar7->exprsnum = iVar4 + 1;
        peVar7->exprs[iVar4] = peVar9;
        iVar4 = peVar5->operandsnum;
        iVar13 = peVar5->operandsmax;
        if (iVar13 <= iVar4) {
          iVar14 = iVar13 * 2;
          if (iVar13 == 0) {
            iVar14 = 0x10;
          }
          peVar5->operandsmax = iVar14;
          ppeVar10 = (easm_operand **)realloc(peVar5->operands,(long)iVar14 << 3);
          peVar5->operands = ppeVar10;
        }
        peVar5->operandsnum = iVar4 + 1;
        peVar5->operands[iVar4] = peVar7;
      }
      iVar4 = *spos;
    } while (iVar4 < ctx->atomsnum);
  }
  peVar5->mods = peVar6;
  return peVar5;
}

Assistant:

static struct easm_sinsn *dis_parse_sinsn(struct disctx *ctx, enum dis_status *status, int *spos) {
	struct easm_sinsn *res = calloc(sizeof *res, 1);
	res->str = ctx->atoms[*spos]->str;
	res->isunk = ctx->atoms[*spos]->isunk;
	if (res->isunk)
		*status |= DIS_STATUS_UNK_INSN;
	if (ctx->atoms[(*spos)++]->type != LITEM_NAME)
		abort();
	struct easm_mods *mods = calloc (sizeof *mods, 1);
	while (*spos < ctx->atomsnum && ctx->atoms[*spos]->type != LITEM_SEEND) {
		if (ctx->atoms[*spos]->type == LITEM_NAME) {
			struct easm_mod *mod = calloc(sizeof *mod, 1);
			mod->str = ctx->atoms[*spos]->str;
			mod->isunk = ctx->atoms[*spos]->isunk;
			if (mod->isunk)
				*status |= DIS_STATUS_UNK_OPERAND;
			ADDARRAY(mods->mods, mod);
			(*spos)++;
		} else {
			struct easm_operand *op = calloc (sizeof *op, 1);
			op->mods = mods;
			mods = calloc (sizeof *mods, 1);
			ADDARRAY(op->exprs, dis_parse_expr(ctx, status, spos));
			ADDARRAY(res->operands, op);
		}
	}
	res->mods = mods;
	return res;
}